

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

bool test64Deserialize(string *filename)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  int line;
  size_type sVar1;
  vector<char,_std::allocator<char>_> *pvVar2;
  char *pcVar3;
  char *pcVar4;
  reference pvVar5;
  size_t __n;
  size_t i;
  vector<char,_std::allocator<char>_> buf2;
  Roaring64Map roaring;
  vector<char,_std::allocator<char>_> buf1;
  ifstream in;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  Roaring64Map *in_stack_fffffffffffffc90;
  istream_type *in_stack_fffffffffffffc98;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  undefined1 portable;
  undefined1 *__n_00;
  Roaring64Map *in_stack_fffffffffffffcb0;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  streambuf_type *in_stack_fffffffffffffcd8;
  char *file;
  char *__n_01;
  undefined8 in_stack_fffffffffffffce0;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  char *in_stack_fffffffffffffd08;
  Roaring64Map local_2c0;
  allocator_type local_281 [33];
  vector<char,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  undefined1 local_218 [535];
  byte local_1;
  
  portable = (undefined1)((ulong)in_stack_fffffffffffffca8 >> 0x38);
  __rhs = local_238;
  std::operator+((char *)in_stack_fffffffffffffcd8,__rhs);
  std::ifstream::ifstream(local_218,(string *)__rhs,_S_bin);
  std::__cxx11::string::~string((string *)local_238);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90);
  __a = local_281;
  std::allocator<char>::allocator();
  __last._8_8_ = in_stack_fffffffffffffce0;
  __last._M_sbuf = in_stack_fffffffffffffcd8;
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,_std::allocator<char>_> *)__rhs,in_stack_fffffffffffffce8,__last,__a);
  std::allocator<char>::~allocator(local_281);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&local_260);
  printf("Reading %lu bytes\n",sVar1);
  ::roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffc90);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1078a9);
  std::vector<char,_std::allocator<char>_>::size(&local_260);
  ::roaring::Roaring64Map::readSafe
            (in_stack_fffffffffffffd08,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
            );
  ::roaring::Roaring64Map::operator=
            (in_stack_fffffffffffffc90,
             (Roaring64Map *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  ::roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1078f1);
  pvVar2 = (vector<char,_std::allocator<char>_> *)
           ::roaring::Roaring64Map::getSizeInBytes(in_stack_fffffffffffffcb0,(bool)portable);
  __n_00 = &stack0xfffffffffffffce7;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (pvVar2,(size_type)__n_00,(allocator_type *)in_stack_fffffffffffffca0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffce7);
  pvVar2 = (vector<char,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::size(&local_260);
  std::vector<char,_std::allocator<char>_>::size
            ((vector<char,_std::allocator<char>_> *)&stack0xfffffffffffffce8);
  __n = 0x80d;
  _assert_true((unsigned_long)pvVar2,(char *)in_stack_fffffffffffffc98,
               (char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x107a4c);
  pcVar3 = (char *)::roaring::Roaring64Map::write(&local_2c0,(int)pcVar3,(void *)0x1,__n);
  std::vector<char,_std::allocator<char>_>::size
            ((vector<char,_std::allocator<char>_> *)&stack0xfffffffffffffce8);
  _assert_true((unsigned_long)pvVar2,pcVar3,(char *)in_stack_fffffffffffffc90,
               in_stack_fffffffffffffc8c);
  file = (char *)0x0;
  while( true ) {
    __n_01 = file;
    pcVar4 = (char *)std::vector<char,_std::allocator<char>_>::size(&local_260);
    if (pcVar4 <= file) break;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&local_260,(size_type)__n_01);
    line = (int)*pvVar5;
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)&stack0xfffffffffffffce8,(size_type)__n_01);
    _assert_true((unsigned_long)pvVar2,pcVar3,file,line);
    file = __n_01 + 1;
  }
  local_1 = 1;
  std::vector<char,_std::allocator<char>_>::~vector(pvVar2);
  ::roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x107ba2);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar2);
  std::ifstream::~ifstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

bool test64Deserialize(const std::string &filename) {
#if CROARING_IS_BIG_ENDIAN
    (void)filename;
    printf("Big-endian IO unsupported.\n");
#else  // CROARING_IS_BIG_ENDIAN
    std::ifstream in(TEST_DATA_DIR + filename, std::ios::binary);
    std::vector<char> buf1(std::istreambuf_iterator<char>(in), {});
    printf("Reading %lu bytes\n", (unsigned long)buf1.size());
    Roaring64Map roaring;
#if ROARING_EXCEPTIONS
    try {
        roaring = Roaring64Map::readSafe(buf1.data(), buf1.size());
    } catch (...) {
        return false;
    }
#else   // ROARING_EXCEPTIONS
    roaring = Roaring64Map::readSafe(buf1.data(), buf1.size());
#endif  // ROARING_EXCEPTIONS
    std::vector<char> buf2(roaring.getSizeInBytes());
    assert_true(buf1.size() == buf2.size());
    assert_true(roaring.write(buf2.data()) == buf2.size());
    for (size_t i = 0; i < buf1.size(); ++i) {
        assert_true(buf1[i] == buf2[i]);
    }
#endif  // CROARING_IS_BIG_ENDIAN
    return true;
}